

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

void drawHighlight(int nodeIndex)

{
  char cVar1;
  reference pvVar2;
  size_type sVar3;
  size_type sVar4;
  undefined8 uVar5;
  WINDOW *pWVar6;
  int local_50;
  int local_4c;
  int beg_y;
  int beg_x;
  node *tmp_node;
  int nodeIndex_local;
  
  pvVar2 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)nodeIndex);
  if (pvVar2->pc == '\0') {
    pWVar6 = pvVar2->w_code;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&pvVar2->inputCode);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&pvVar2->inputCode);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&pvVar2->inputCode,sVar4 - 1);
    uVar5 = std::__cxx11::string::c_str();
    mvwprintw(pWVar6,(int)sVar3 + -1,0,"%s",uVar5);
  }
  else {
    pWVar6 = pvVar2->w_code;
    cVar1 = pvVar2->pc;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&pvVar2->inputCode,(long)(pvVar2->pc + -1));
    uVar5 = std::__cxx11::string::c_str();
    mvwprintw(pWVar6,cVar1 + -1,0,"%s",uVar5);
  }
  if (pvVar2->w_code == (WINDOW *)0x0) {
    local_4c = -1;
  }
  else {
    local_4c = (int)pvVar2->w_code->_begy;
  }
  if (pvVar2->w_code == (WINDOW *)0x0) {
    local_50 = -1;
  }
  else {
    local_50 = (int)pvVar2->w_code->_begx;
  }
  if (pvVar2->w_highlight != (WINDOW *)0x0) {
    delwin(pvVar2->w_highlight);
  }
  pvVar2 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)nodeIndex);
  pWVar6 = (WINDOW *)newwin(1,0x12,local_4c + pvVar2->pc,local_50);
  pvVar2->w_highlight = pWVar6;
  wattr_on(pvVar2->w_highlight,0x100,0);
  wbkgd(pvVar2->w_highlight,0x100);
  wbkgd(pvVar2->w_code,0x500);
  pWVar6 = pvVar2->w_highlight;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&pvVar2->inputCode,(long)pvVar2->pc);
  uVar5 = std::__cxx11::string::c_str();
  mvwprintw(pWVar6,0,0,"%s",uVar5);
  wrefresh(pvVar2->w_code);
  wrefresh(pvVar2->w_highlight);
  return;
}

Assistant:

void drawHighlight(int nodeIndex){
  node *tmp_node =&grid[nodeIndex];
  int beg_x, beg_y;
  if(tmp_node->pc==0){
    mvwprintw(tmp_node->w_code, tmp_node->inputCode.size()-1, 0, "%s", tmp_node->inputCode[tmp_node->inputCode.size()-1].c_str());
  }
  else{
    mvwprintw(tmp_node->w_code, tmp_node->pc-1, 0, "%s", tmp_node->inputCode[tmp_node->pc-1].c_str());
  }
  getbegyx(tmp_node->w_code, beg_y, beg_x);
  if(tmp_node->w_highlight){
    //werase(tmp_node->w_highlight);
    delwin(tmp_node->w_highlight);
  }
  tmp_node=&grid[nodeIndex];
  //start_color();
  tmp_node->w_highlight = newwin(1, CODE_WIDTH - 2, beg_y+tmp_node->pc, beg_x);
  //init_pair(1, COLOR_BLACK, COLOR_WHITE);
  wattron(tmp_node->w_highlight,COLOR_PAIR(1));
  wbkgd(tmp_node->w_highlight, COLOR_PAIR(1));
  wbkgd(tmp_node->w_code, COLOR_PAIR(5));
  mvwprintw(tmp_node->w_highlight, 0, 0, "%s", tmp_node->inputCode[tmp_node->pc].c_str());
  wrefresh(tmp_node->w_code);
  wrefresh(tmp_node->w_highlight);
}